

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

int encode_string(char *dst,size_t dst_len,argon2_context *ctx,argon2_type type)

{
  char *__s;
  char *pcVar1;
  size_t sVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sb_len_1;
  size_t pp_len_11;
  size_t sb_len;
  size_t pp_len_10;
  size_t pp_len_9;
  char tmp_3 [30];
  size_t pp_len_8;
  size_t pp_len_7;
  char tmp_2 [30];
  size_t pp_len_6;
  size_t pp_len_5;
  char tmp_1 [30];
  size_t pp_len_4;
  size_t pp_len_3;
  char tmp [30];
  size_t pp_len_2;
  size_t pp_len_1;
  size_t pp_len;
  int validation_result;
  char *type_string;
  argon2_type type_local;
  argon2_context *ctx_local;
  size_t dst_len_local;
  char *dst_local;
  
  __s = argon2_type2string(type,0);
  dst_local._4_4_ = validate_inputs(ctx);
  if (__s == (char *)0x0) {
    dst_local._4_4_ = -0x1f;
  }
  else if (dst_local._4_4_ == 0) {
    if (dst_len < 2) {
      dst_local._4_4_ = -0x1f;
    }
    else {
      memcpy(dst,"$",2);
      pcVar1 = dst + 1;
      sVar2 = strlen(__s);
      if (sVar2 < dst_len - 1) {
        memcpy(pcVar1,__s,sVar2 + 1);
        pcVar1 = pcVar1 + sVar2;
        uVar3 = (dst_len - 1) - sVar2;
        stack0xffffffffffffffa8 = 3;
        if (uVar3 < 4) {
          dst_local._4_4_ = -0x1f;
        }
        else {
          memcpy(pcVar1,"$v=",4);
          pcVar1 = pcVar1 + stack0xffffffffffffffa8;
          uVar3 = uVar3 - stack0xffffffffffffffa8;
          sprintf((char *)&pp_len_3,"%lu",(ulong)ctx->version);
          sVar2 = strlen((char *)&pp_len_3);
          if (sVar2 < uVar3) {
            memcpy(pcVar1,&pp_len_3,sVar2 + 1);
            pcVar1 = pcVar1 + sVar2;
            uVar3 = uVar3 - sVar2;
            stack0xffffffffffffff78 = 3;
            if (uVar3 < 4) {
              dst_local._4_4_ = -0x1f;
            }
            else {
              memcpy(pcVar1,"$m=",4);
              pcVar1 = pcVar1 + stack0xffffffffffffff78;
              uVar3 = uVar3 - stack0xffffffffffffff78;
              sprintf((char *)&pp_len_5,"%lu",(ulong)ctx->m_cost);
              sVar2 = strlen((char *)&pp_len_5);
              if (sVar2 < uVar3) {
                memcpy(pcVar1,&pp_len_5,sVar2 + 1);
                pcVar1 = pcVar1 + sVar2;
                uVar3 = uVar3 - sVar2;
                stack0xffffffffffffff48 = 3;
                if (uVar3 < 4) {
                  dst_local._4_4_ = -0x1f;
                }
                else {
                  memcpy(pcVar1,",t=",4);
                  pcVar1 = pcVar1 + stack0xffffffffffffff48;
                  uVar3 = uVar3 - stack0xffffffffffffff48;
                  sprintf((char *)&pp_len_7,"%lu",(ulong)ctx->t_cost);
                  sVar2 = strlen((char *)&pp_len_7);
                  if (sVar2 < uVar3) {
                    memcpy(pcVar1,&pp_len_7,sVar2 + 1);
                    pcVar1 = pcVar1 + sVar2;
                    uVar3 = uVar3 - sVar2;
                    stack0xffffffffffffff18 = 3;
                    if (uVar3 < 4) {
                      dst_local._4_4_ = -0x1f;
                    }
                    else {
                      memcpy(pcVar1,",p=",4);
                      pcVar1 = pcVar1 + stack0xffffffffffffff18;
                      uVar3 = uVar3 - stack0xffffffffffffff18;
                      sprintf((char *)&pp_len_9,"%lu",(ulong)ctx->lanes);
                      sVar2 = strlen((char *)&pp_len_9);
                      if (sVar2 < uVar3) {
                        memcpy(pcVar1,&pp_len_9,sVar2 + 1);
                        pcVar1 = pcVar1 + sVar2;
                        uVar3 = uVar3 - sVar2;
                        if (uVar3 < 2) {
                          dst_local._4_4_ = -0x1f;
                        }
                        else {
                          memcpy(pcVar1,"$",2);
                          pcVar1 = pcVar1 + 1;
                          sVar4 = uVar3 - 1;
                          sVar5 = to_base64(pcVar1,sVar4,ctx->salt,(ulong)ctx->saltlen);
                          if (sVar5 == 0xffffffffffffffff) {
                            dst_local._4_4_ = -0x1f;
                          }
                          else {
                            uVar3 = sVar4 - sVar5;
                            if (uVar3 < 2) {
                              dst_local._4_4_ = -0x1f;
                            }
                            else {
                              memcpy(pcVar1 + sVar5,"$",2);
                              sVar4 = to_base64(pcVar1 + sVar5 + 1,uVar3 - 1,ctx->out,
                                                (ulong)ctx->outlen);
                              if (sVar4 == 0xffffffffffffffff) {
                                dst_local._4_4_ = -0x1f;
                              }
                              else {
                                dst_local._4_4_ = 0;
                              }
                            }
                          }
                        }
                      }
                      else {
                        dst_local._4_4_ = -0x1f;
                      }
                    }
                  }
                  else {
                    dst_local._4_4_ = -0x1f;
                  }
                }
              }
              else {
                dst_local._4_4_ = -0x1f;
              }
            }
          }
          else {
            dst_local._4_4_ = -0x1f;
          }
        }
      }
      else {
        dst_local._4_4_ = -0x1f;
      }
    }
  }
  return dst_local._4_4_;
}

Assistant:

int encode_string(char *dst, size_t dst_len, argon2_context *ctx,
                  argon2_type type) {
#define SS(str)                                                                \
    do {                                                                       \
        size_t pp_len = strlen(str);                                           \
        if (pp_len >= dst_len) {                                               \
            return ARGON2_ENCODING_FAIL;                                       \
        }                                                                      \
        memcpy(dst, str, pp_len + 1);                                          \
        dst += pp_len;                                                         \
        dst_len -= pp_len;                                                     \
    } while ((void)0, 0)

#define SX(x)                                                                  \
    do {                                                                       \
        char tmp[30];                                                          \
        sprintf(tmp, "%lu", (unsigned long)(x));                               \
        SS(tmp);                                                               \
    } while ((void)0, 0)

#define SB(buf, len)                                                           \
    do {                                                                       \
        size_t sb_len = to_base64(dst, dst_len, buf, len);                     \
        if (sb_len == (size_t)-1) {                                            \
            return ARGON2_ENCODING_FAIL;                                       \
        }                                                                      \
        dst += sb_len;                                                         \
        dst_len -= sb_len;                                                     \
    } while ((void)0, 0)

    const char* type_string = argon2_type2string(type, 0);
    int validation_result = validate_inputs(ctx);

    if (!type_string) {
        return ARGON2_ENCODING_FAIL;
    }

    if (validation_result != ARGON2_OK) {
        return validation_result;
    }

    SS("$");
    SS(type_string);

    SS("$v=");
    SX(ctx->version);

    SS("$m=");
    SX(ctx->m_cost);
    SS(",t=");
    SX(ctx->t_cost);
    SS(",p=");
    SX(ctx->lanes);

    SS("$");
    SB(ctx->salt, ctx->saltlen);

    SS("$");
    SB(ctx->out, ctx->outlen);
    return ARGON2_OK;

#undef SS
#undef SX
#undef SB
}